

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O1

ATNPath * __thiscall Centaurus::ATNPath::parent_path(ATNPath *__return_storage_ptr__,ATNPath *this)

{
  pointer ppVar1;
  pointer pwVar2;
  
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::vector(&__return_storage_ptr__->
            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ,&this->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          );
  __return_storage_ptr__->_vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019d838;
  ppVar1 = (__return_storage_ptr__->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  ppVar1[-1].first._vptr_Identifier = (_func_int **)&PTR__Identifier_0019cdf0;
  pwVar2 = ppVar1[-1].first.m_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &ppVar1[-1].first.m_id.field_2) {
    operator_delete(pwVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

ATNPath parent_path() const
    {
        ATNPath new_path(*this);

        new_path.pop();

        return new_path;
    }